

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

InterfaceHandle __thiscall
helics::CommonCore::getDataSink(CommonCore *this,LocalFederateId federateID,string_view name)

{
  bool bVar1;
  type p_Var2;
  LocalFederateId in_ESI;
  ordered_guarded<helics::HandleManager,_std::shared_mutex> *unaff_retaddr;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  *ept;
  InterfaceHandle in_stack_fffffffffffffffc;
  
  p_Var2 = gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
           read<helics::CommonCore::getDataSink(helics::LocalFederateId,std::basic_string_view<char,std::char_traits<char>>)const::__0>
                     (unaff_retaddr,
                      (anon_class_8_1_898f2789 *)CONCAT44(in_stack_fffffffffffffffc.hid,in_ESI.fid))
  ;
  bVar1 = LocalFederateId::operator!=
                    ((LocalFederateId *)
                     &p_Var2->
                      super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                     ,in_ESI);
  if (bVar1) {
    memset(&stack0xfffffffffffffffc,0,4);
    InterfaceHandle::InterfaceHandle((InterfaceHandle *)&stack0xfffffffffffffffc);
  }
  else {
    in_stack_fffffffffffffffc.hid = *(BaseType *)((long)&(p_Var2->super__Hash_node_base)._M_nxt + 4)
    ;
  }
  return (InterfaceHandle)in_stack_fffffffffffffffc.hid;
}

Assistant:

InterfaceHandle CommonCore::getDataSink(LocalFederateId federateID, std::string_view name) const
{
    const auto* ept = handles.read(
        [&name](auto& hand) { return hand.getInterfaceHandle(name, InterfaceType::SINK); });
    if (ept->local_fed_id != federateID) {
        return {};
    }
    return ept->handle.handle;
}